

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::truncated_normal_dist<double>::operator()(truncated_normal_dist<double> *this,lcg64_shift *r)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = (r->S).r * (r->P).a + (r->P).b;
  uVar2 = uVar1 >> 0x11 ^ uVar1;
  uVar2 = uVar2 << 0x1f ^ uVar2;
  (r->S).r = uVar1;
  dVar3 = (this->P).Phi_a;
  dVar3 = math::detail::inv_Phi<double>
                    (((this->P).Phi_b - dVar3) *
                     ((double)(uVar2 >> 1 ^ uVar2 >> 9) * 1.084202172485504e-19 +
                     2.220446049250313e-16) + dVar3);
  return dVar3 * (this->P).sigma_ + (this->P).mu_;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf(utility::uniformoo<result_type>(r));
    }